

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O1

QDataStream * __thiscall QDataStream::operator<<(QDataStream *this,qint64 i)

{
  ssize_t sVar1;
  size_t in_RCX;
  quint32 i1;
  long in_FS_OFFSET;
  ulong local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = i;
  if ((this->dev != (QIODevice *)0x0) && (this->q_status == '\0')) {
    if (this->ver < 6) {
      operator<<(this,(qint32)((ulong)i >> 0x20));
      operator<<(this,(qint32)i);
    }
    else {
      if (this->noswap == false) {
        local_20 = (ulong)i >> 0x38 | (i & 0xff000000000000U) >> 0x28 |
                   (i & 0xff0000000000U) >> 0x18 | (i & 0xff00000000U) >> 8 | (i & 0xff000000U) << 8
                   | (i & 0xff0000U) << 0x18 | (i & 0xff00U) << 0x28 | i << 0x38;
      }
      sVar1 = QIODevice::write(this->dev,(int)&local_20,(void *)0x8,in_RCX);
      if (sVar1 != 8) {
        this->q_status = '\x03';
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &QDataStream::operator<<(qint64 i)
{
    CHECK_STREAM_WRITE_PRECOND(*this)
    if (version() < 6) {
        quint32 i1 = i & 0xffffffff;
        quint32 i2 = i >> 32;
        *this << i2 << i1;
    } else {
        if (!noswap) {
            i = qbswap(i);
        }
        if (dev->write((char *)&i, sizeof(qint64)) != sizeof(qint64))
            q_status = WriteFailed;
    }
    return *this;
}